

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

int __thiscall
gmlc::utilities::string_viewOps::trailingStringInt
          (string_viewOps *this,string_view input,string_view *output,int defNum)

{
  string_viewOps sVar1;
  int iVar2;
  void *pvVar3;
  string_viewOps *psVar4;
  long lVar5;
  ulong *puVar6;
  string_viewOps *psVar7;
  int iVar8;
  ulong uVar9;
  const_iterator __end2;
  string_viewOps *psVar10;
  ulong uVar11;
  
  iVar8 = (int)output;
  puVar6 = (ulong *)input._M_str;
  uVar9 = input._M_len;
  if ((this != (string_viewOps *)0x0) &&
     (sVar1 = this[uVar9 - 1], 0xf5 < (byte)((char)sVar1 - 0x3aU))) {
    psVar10 = (string_viewOps *)0x0;
    uVar11 = uVar9;
LAB_00394e74:
    pvVar3 = memchr("0123456789",(int)(char)this[uVar11 - 1],10);
    if (pvVar3 != (void *)0x0) goto code_r0x00394e8c;
    psVar4 = this + ~(ulong)psVar10;
    if (psVar10 == (string_viewOps *)0x1) {
      iVar8 = (byte)sVar1 - 0x30;
      psVar10 = psVar4;
      goto LAB_00394f60;
    }
    if (((string_viewOps *)0xa < this) && (psVar10 = this + -10, psVar4 < psVar10)) {
      iVar8 = 0;
      lVar5 = -9;
      do {
        iVar2 = ((byte)this[lVar5 + uVar9] - 0x30) + iVar8 * 10;
        if (9 < (byte)((char)this[lVar5 + uVar9] - 0x30U)) {
          iVar2 = iVar8;
        }
        iVar8 = iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
      goto LAB_00394f60;
    }
    goto LAB_00394f2e;
  }
LAB_00394f7e:
  *puVar6 = (ulong)this;
  puVar6[1] = uVar9;
  return iVar8;
code_r0x00394e8c:
  psVar10 = psVar10 + 1;
  uVar11 = uVar11 - 1;
  if (this == psVar10) goto code_r0x00394e97;
  goto LAB_00394e74;
code_r0x00394e97:
  if (this < (string_viewOps *)0xb) {
    *puVar6 = 0;
    puVar6[1] = 0;
    psVar10 = (string_viewOps *)0x0;
    iVar8 = 0;
    do {
      iVar2 = ((byte)psVar10[uVar9] - 0x30) + iVar8 * 10;
      if (9 < (byte)((char)psVar10[uVar9] - 0x30U)) {
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
      psVar10 = psVar10 + 1;
    } while (this != psVar10);
    return iVar8;
  }
  psVar4 = this + -10;
LAB_00394f2e:
  psVar7 = psVar4 + 1;
  if (this <= psVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",psVar7
               ,this);
  }
  iVar8 = 0;
  psVar10 = psVar4;
  if (psVar7 != this) {
    iVar8 = 0;
    do {
      iVar2 = ((byte)psVar7[uVar9] - 0x30) + iVar8 * 10;
      if (9 < (byte)((char)psVar7[uVar9] - 0x30U)) {
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
      psVar7 = psVar7 + 1;
    } while (this != psVar7);
  }
LAB_00394f60:
  if ((psVar10[uVar9] != (string_viewOps)0x5f) && (psVar10[uVar9] != (string_viewOps)0x23)) {
    psVar10 = psVar10 + 1;
  }
  if (psVar10 <= this) {
    this = psVar10;
  }
  goto LAB_00394f7e;
}

Assistant:

int trailingStringInt(
    std::string_view input,
    std::string_view& output,
    int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        output = input;
        return defNum;
    }
    int num = defNum;
    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            output = std::string_view{};
            num = toIntSimple(input);
            return num;
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        num = input.back() - '0';
    } else if (length <= 10 || pos1 >= length - 10) {
        num = toIntSimple(input.substr(pos1 + 1));
    } else {
        num = toIntSimple(input.substr(length - 9));
        pos1 = length - 10;
    }

    if (input[pos1] == '_' || input[pos1] == '#') {
        output = input.substr(0, pos1);
    } else {
        output = input.substr(0, pos1 + 1);
    }

    return num;
}